

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

string * duckdb_re2::ProgToString_abi_cxx11_(Prog *prog,Workq *q)

{
  uint uVar1;
  uint *puVar2;
  InstOp IVar3;
  uint *puVar4;
  undefined8 uVar5;
  Prog *in_RDX;
  string *in_RDI;
  Inst *ip;
  int id;
  iterator i;
  string *s;
  int in_stack_ffffffffffffff2c;
  Prog *in_stack_ffffffffffffff30;
  string *this;
  string local_80 [32];
  string local_60 [32];
  Inst *local_40;
  uint local_38;
  uint *local_28;
  undefined1 local_19;
  Prog *local_18;
  
  local_19 = 0;
  this = in_RDI;
  local_18 = in_RDX;
  std::__cxx11::string::string((string *)in_RDI);
  for (local_28 = (uint *)SparseSetT<void>::begin((SparseSetT<void> *)0x84ccb6); puVar2 = local_28,
      puVar4 = (uint *)SparseSetT<void>::end((SparseSetT<void> *)in_stack_ffffffffffffff30),
      puVar2 != puVar4; local_28 = local_28 + 1) {
    local_38 = *local_28;
    local_40 = Prog::inst(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    uVar1 = local_38;
    Prog::Inst::Dump_abi_cxx11_((Inst *)this);
    uVar5 = std::__cxx11::string::c_str();
    StringPrintf_abi_cxx11_((char *)local_60,"%d. %s\n",(ulong)uVar1,uVar5);
    std::__cxx11::string::operator+=((string *)this,local_60);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_80);
    Prog::Inst::out(local_40);
    AddToQueue((Workq *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    IVar3 = Prog::Inst::opcode(local_40);
    if ((IVar3 == kInstAlt) || (IVar3 = Prog::Inst::opcode(local_40), IVar3 == kInstAltMatch)) {
      in_stack_ffffffffffffff30 = local_18;
      Prog::Inst::out1(local_40);
      AddToQueue((Workq *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    }
  }
  return in_RDI;
}

Assistant:

static std::string ProgToString(Prog* prog, Workq* q) {
  std::string s;
  for (Workq::iterator i = q->begin(); i != q->end(); ++i) {
    int id = *i;
    Prog::Inst* ip = prog->inst(id);
    s += StringPrintf("%d. %s\n", id, ip->Dump().c_str());
    AddToQueue(q, ip->out());
    if (ip->opcode() == kInstAlt || ip->opcode() == kInstAltMatch)
      AddToQueue(q, ip->out1());
  }
  return s;
}